

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O1

int bcache_write_partial
              (filemgr *file,bid_t bid,void *buf,size_t offset,size_t len,bool final_write)

{
  avl_node **ppaVar1;
  fnamedic_item *pfVar2;
  hash_elem *phVar3;
  long *plVar4;
  ulong uVar5;
  size_t sVar6;
  timeval tp;
  bcache_item query;
  timeval local_80;
  bid_t local_70;
  hash_elem local_60 [2];
  
  pfVar2 = (file->bcache)._M_b._M_p;
  if (pfVar2 == (fnamedic_item *)0x0) {
    pthread_spin_lock(&bcache_lock);
    pfVar2 = (file->bcache)._M_b._M_p;
    if (pfVar2 == (fnamedic_item *)0x0) {
      pfVar2 = _fname_create(file);
    }
    pthread_spin_unlock(&bcache_lock);
  }
  sVar6 = 0;
  gettimeofday(&local_80,(__timezone_ptr_t)0x0);
  (pfVar2->access_timestamp).super___atomic_base<unsigned_long>._M_i =
       local_80.tv_sec * 1000000 + local_80.tv_usec;
  uVar5 = bid % pfVar2->num_shards;
  local_70 = bid;
  pthread_spin_lock(&pfVar2->shards[uVar5].lock);
  phVar3 = hash_find(&pfVar2->shards[uVar5].hashtable,local_60);
  if (phVar3 == (hash_elem *)0x0) {
    pthread_spin_unlock(&pfVar2->shards[uVar5].lock);
    goto LAB_0010b71c;
  }
  if (((ulong)phVar3[1].avl.right & 4) != 0) goto LAB_0010b71c;
  if (((ulong)phVar3[1].avl.right & 1) == 0) {
    list_remove(&pfVar2->shards[uVar5].cleanlist,(list_elem *)(phVar3 + 1));
    plVar4 = (long *)malloc(0x20);
    *plVar4 = (long)&phVar3[-1].avl.left;
    if (*(char *)((long)phVar3[-1].avl.right + (long)bcache_blocksize + -1) == -1) {
      avl_insert(&pfVar2->shards[uVar5].tree_idx,(avl_node *)(plVar4 + 1),_dirty_cmp);
    }
    else {
      avl_insert(&pfVar2->shards[uVar5].tree,(avl_node *)(plVar4 + 1),_dirty_cmp);
      if (final_write) goto LAB_0010b6b5;
    }
  }
  else if (final_write && ((ulong)phVar3[1].avl.right & 2) == 0) {
LAB_0010b6b5:
    LOCK();
    ppaVar1 = &phVar3[1].avl.right;
    *(byte *)ppaVar1 = *(byte *)ppaVar1 | 2;
    UNLOCK();
    LOCK();
    (pfVar2->nimmutable).super___atomic_base<unsigned_long>._M_i =
         (pfVar2->nimmutable).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  LOCK();
  ppaVar1 = &phVar3[1].avl.right;
  *(byte *)ppaVar1 = *(byte *)ppaVar1 | 1;
  UNLOCK();
  memcpy((void *)((long)&(phVar3[-1].avl.right)->parent + offset),buf,len);
  *(bool *)((long)&phVar3[1].avl.right + 1) =
       *(char *)((long)phVar3[-1].avl.right + (long)bcache_blocksize + -1) == -1;
  pthread_spin_unlock(&pfVar2->shards[uVar5].lock);
  sVar6 = len;
LAB_0010b71c:
  return (int)sVar6;
}

Assistant:

int bcache_write_partial(struct filemgr *file,
                         bid_t bid,
                         void *buf,
                         size_t offset,
                         size_t len,
                         bool final_write)
{
    struct hash_elem *h;
    struct bcache_item *item;
    struct bcache_item query;
    struct fnamedic_item *fname_new;

    fname_new = file->bcache;
    if (fname_new == NULL) {
        spin_lock(&bcache_lock);
        fname_new = file->bcache;
        if (fname_new == NULL) {
            // filename doesn't exist in filename dictionary .. create
            fname_new = _fname_create(file);
        }
        spin_unlock(&bcache_lock);
    }

    // Update the access timestamp.
    struct timeval tp;
    gettimeofday(&tp, NULL);
    atomic_store_uint64_t(&fname_new->access_timestamp,
                          (uint64_t) (tp.tv_sec * 1000000 + tp.tv_usec),
                          std::memory_order_relaxed);

    size_t shard_num = bid % fname_new->num_shards;
    // set query
    query.bid = bid;

    spin_lock(&fname_new->shards[shard_num].lock);

    // search hash table
    h = hash_find(&fname_new->shards[shard_num].hashtable, &query.hash_elem);
    if (h == NULL) {
        // cache miss .. partial write fail .. return 0
        spin_unlock(&fname_new->shards[shard_num].lock);
        return 0;

    } else {
        // cache hit .. get the block
        item = _get_entry(h, struct bcache_item, hash_elem);
    }

    if (item->flag & BCACHE_FREE) {
        DBG("Warning: failed to write on the buffer cache entry for a file '%s' "
            "because the entry belongs to the free list!\n",
            file->filename);
        return 0;
    }

    // check whether this is dirty block
    // to avoid re-insert already existing item into tree
    if (!(item->flag & BCACHE_DIRTY)) {
        // this block was clean block
        uint8_t marker;
        struct dirty_item *ditem;

        // remove from clean list
        list_remove(&fname_new->shards[shard_num].cleanlist, &item->list_elem);

        ditem = (struct dirty_item *)mempool_alloc(sizeof(struct dirty_item));
        ditem->item = item;

        // insert into tree
        marker = *((uint8_t*)item->addr + bcache_blocksize-1);
        if (marker == BLK_MARKER_BNODE ) {
            // b-tree node
            avl_insert(&fname_new->shards[shard_num].tree_idx, &ditem->avl, _dirty_cmp);
        } else {
            avl_insert(&fname_new->shards[shard_num].tree, &ditem->avl,
                       _dirty_cmp);
            if (final_write) {
                item->flag |= BCACHE_IMMUTABLE; // (fully written doc block)
                atomic_incr_uint64_t(&fname_new->nimmutable);
            }
        }
    } else if (!(item->flag & BCACHE_IMMUTABLE)) {
        if (final_write) {
            item->flag |= BCACHE_IMMUTABLE; // (fully written doc block)
            atomic_incr_uint64_t(&fname_new->nimmutable);
        }
    }

    // always set this block as dirty
    item->flag |= BCACHE_DIRTY;

    memcpy((uint8_t *)(item->addr) + offset, buf, len);
    _bcache_set_score(item);

    spin_unlock(&fname_new->shards[shard_num].lock);

    return len;
}